

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  HexBool local_2c;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  if (PVar1 == PRECISION_HIGHP) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar3 = *(uint *)((long)*inputs + uVar6 * 4);
      uVar3 = (uint)((uVar3 & 0x7fffff) != 0 && (~uVar3 & 0x7f800000) == 0);
      if (*(uint *)((long)*outputs + uVar6 * 4) != uVar3) {
        poVar4 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar6);
        poVar4 = std::operator<<(poVar4,"] = ");
        local_2c.value = uVar3;
        Functional::operator<<(poVar4,&local_2c);
        return false;
      }
    }
  }
  else {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (1 < *(uint *)((long)*outputs + uVar6 * 4)) {
        poVar4 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar6);
        std::operator<<(poVar4,"] = 0 / 1");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
				const deUint32	ref		= tcu::Float32(in0).isNaN() ? 1u : 0u;

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else
		{
			// Value can be either 0 or 1
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int out0 = ((const int*)outputs[0])[compNdx];

				if (out0 != 0 && out0 != 1)
				{
					m_failMsg << "Expected [" << compNdx << "] = 0 / 1";
					return false;
				}
			}
		}

		return true;
	}